

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print_info.cc
# Opt level: O3

void lf::mesh::utils::PrintInfo(ostream *o,Mesh *mesh,int ctrl)

{
  long *plVar1;
  RefElType RVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  undefined8 *puVar8;
  long *plVar9;
  MatrixXd *pMVar10;
  runtime_error *prVar11;
  long extraout_RDX;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  RefEl e_refel;
  stringstream ss;
  RefEl local_25d;
  uint local_25c;
  ulong local_258;
  string local_250;
  string local_230;
  string local_210;
  uint local_1f0;
  int local_1ec;
  undefined8 *local_1e8;
  MatrixXd *local_1e0;
  long *local_1d8;
  undefined8 *local_1d0;
  ulong local_1c8;
  long *local_1c0;
  string local_1b8 [12];
  undefined4 extraout_var;
  
  uVar3 = (**mesh->_vptr_Mesh)(mesh);
  iVar4 = (*mesh->_vptr_Mesh[1])(mesh);
  std::__ostream_insert<char,std::char_traits<char>>(o,"Mesh of dimension ",0x12);
  local_25c = uVar3;
  poVar7 = (ostream *)std::ostream::operator<<(o,uVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ambient dimension ",0x14);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar4);
  local_1b8[0]._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_1b8,1);
  if ((10 < ctrl) &&
     (local_1f0 = ctrl, uVar3 = lf::base::narrow<int,unsigned_int>(local_25c), -1 < (int)uVar3)) {
    do {
      uVar13 = (ulong)uVar3;
      (*mesh->_vptr_Mesh[3])(mesh,uVar13);
      std::__ostream_insert<char,std::char_traits<char>>(o,"Co-dimension ",0xd);
      poVar7 = (ostream *)std::ostream::operator<<(o,uVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,": ",2);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," entities",9);
      local_1b8[0]._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_1b8,1);
      iVar4 = (*mesh->_vptr_Mesh[2])(mesh,uVar13);
      puVar8 = (undefined8 *)CONCAT44(extraout_var,iVar4);
      uVar12 = uVar3;
      if (extraout_RDX != 0) {
        local_1e8 = puVar8 + extraout_RDX;
        local_1ec = local_25c - uVar3;
        local_1c8 = uVar13;
        do {
          plVar1 = (long *)*puVar8;
          local_1d0 = puVar8;
          iVar4 = (*mesh->_vptr_Mesh[5])(mesh,plVar1);
          local_258 = CONCAT44(local_258._4_4_,iVar4);
          iVar4 = (**(code **)*plVar1)(plVar1);
          plVar9 = (long *)(**(code **)(*plVar1 + 0x18))(plVar1);
          local_1c0 = plVar1;
          local_25d.type_ = (**(code **)(*plVar1 + 0x20))(plVar1);
          iVar6 = (int)uVar13;
          if (plVar9 == (long *)0x0) {
            std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
            poVar7 = (ostream *)std::ostream::operator<<(&local_1b8[0].field_2,iVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"-entity ",8);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,": missing geometry",0x12);
            local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"e_geo_ptr","");
            local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_250,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/print_info.cc"
                       ,"");
            std::__cxx11::stringbuf::str();
            lf::base::AssertionFailed(&local_230,&local_250,0x2a,&local_210);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_210._M_dataplus._M_p != &local_210.field_2) {
              operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_dataplus._M_p != &local_250.field_2) {
              operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p != &local_230.field_2) {
              operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1
                             );
            }
            prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar11,"this code should not be reached");
            __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          iVar5 = (**(code **)*plVar9)(plVar9);
          if (iVar5 != local_1ec) {
            std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
            poVar7 = (ostream *)std::ostream::operator<<(&local_1b8[0].field_2,iVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"-entity ",8);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,": wrong dimension",0x11);
            local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_230,"e_geo_ptr->DimLocal() == dim_mesh - co_dim","");
            local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_250,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/print_info.cc"
                       ,"");
            std::__cxx11::stringbuf::str();
            lf::base::AssertionFailed(&local_230,&local_250,0x2c,&local_210);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_210._M_dataplus._M_p != &local_210.field_2) {
              operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_dataplus._M_p != &local_250.field_2) {
              operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p != &local_230.field_2) {
              operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1
                             );
            }
            prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar11,"this code should not be reached");
            __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          RVar2 = (**(code **)(*plVar9 + 0x10))(plVar9);
          if (RVar2 != local_25d.type_) {
            std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
            poVar7 = (ostream *)std::ostream::operator<<(&local_1b8[0].field_2,iVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"-entity ",8);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,": refEl mismatch",0x10);
            local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_230,"e_geo_ptr->RefEl() == e_refel","");
            local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_250,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/print_info.cc"
                       ,"");
            std::__cxx11::stringbuf::str();
            lf::base::AssertionFailed(&local_230,&local_250,0x2e,&local_210);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_210._M_dataplus._M_p != &local_210.field_2) {
              operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_dataplus._M_p != &local_250.field_2) {
              operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p != &local_230.field_2) {
              operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1
                             );
            }
            prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar11,"this code should not be reached");
            __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          if (iVar4 != iVar6) {
            std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
            poVar7 = (ostream *)std::ostream::operator<<(&local_1b8[0].field_2,iVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"-entity ",8);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," co-dimension mismatch",0x16)
            ;
            local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_230,"e_codim == co_dim","");
            local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_250,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/print_info.cc"
                       ,"");
            std::__cxx11::stringbuf::str();
            lf::base::AssertionFailed(&local_230,&local_250,0x30,&local_210);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_210._M_dataplus._M_p != &local_210.field_2) {
              operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_dataplus._M_p != &local_250.field_2) {
              operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p != &local_230.field_2) {
              operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1
                             );
            }
            prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar11,"this code should not be reached");
            __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          local_1d8 = plVar9;
          pMVar10 = lf::base::RefEl::NodeCoords(&local_25d);
          std::__ostream_insert<char,std::char_traits<char>>(o,"entity ",7);
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)o);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," (",2);
          lf::base::RefEl::ToString_abi_cxx11_(local_1b8,&local_25d);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(char *)CONCAT71(local_1b8[0]._M_dataplus._M_p._1_7_,
                                                      local_1b8[0]._M_dataplus._M_p._0_1_),
                              local_1b8[0]._M_string_length);
          local_1e0 = pMVar10;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_1b8[0]._M_dataplus._M_p._1_7_,local_1b8[0]._M_dataplus._M_p._0_1_)
              != &local_1b8[0].field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_1b8[0]._M_dataplus._M_p._1_7_,
                                     local_1b8[0]._M_dataplus._M_p._0_1_),
                            local_1b8[0].field_2._M_allocated_capacity + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"): ",3);
          if (local_1f0 < 0x5b) {
LAB_001439ef:
            if (0x32 < local_1f0) goto LAB_001439fe;
          }
          else {
            iVar4 = lf::base::narrow<int,unsigned_int>(local_25c);
            if (iVar6 < iVar4) {
              uVar15 = 1;
              do {
                std::__ostream_insert<char,std::char_traits<char>>(o,"rel codim-",10);
                poVar7 = (ostream *)std::ostream::operator<<(o,(int)uVar15);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7," subent: [",10);
                local_258 = uVar15;
                auVar16 = (**(code **)(*local_1c0 + 8))(local_1c0,uVar15);
                if (auVar16._8_8_ != 0) {
                  lVar14 = 0;
                  do {
                    (*mesh->_vptr_Mesh[5])(mesh,*(undefined8 *)(auVar16._0_8_ + lVar14));
                    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)o);
                    local_1b8[0]._M_dataplus._M_p._0_1_ = 0x20;
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_1b8,1);
                    lVar14 = lVar14 + 8;
                  } while (auVar16._8_8_ << 3 != lVar14);
                }
                std::__ostream_insert<char,std::char_traits<char>>(o,"]",1);
                iVar4 = (int)local_258;
                iVar6 = lf::base::narrow<int,unsigned_int>(local_25c);
                uVar15 = (ulong)(iVar4 + 1);
                uVar13 = local_1c8;
              } while (iVar4 < iVar6 - (int)local_1c8);
              goto LAB_001439ef;
            }
LAB_001439fe:
            local_1b8[0]._M_dataplus._M_p._0_1_ = 10;
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>(o,(char *)local_1b8,1);
            (**(code **)(*local_1d8 + 0x18))(local_1b8,local_1d8,local_1e0);
            Eigen::operator<<(poVar7,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                     local_1b8);
            free((void *)CONCAT71(local_1b8[0]._M_dataplus._M_p._1_7_,
                                  local_1b8[0]._M_dataplus._M_p._0_1_));
          }
          uVar12 = (uint)uVar13;
          local_1b8[0]._M_dataplus._M_p._0_1_ = 10;
          std::__ostream_insert<char,std::char_traits<char>>(o,(char *)local_1b8,1);
          puVar8 = local_1d0 + 1;
        } while (puVar8 != local_1e8);
      }
      uVar3 = uVar12 - 1;
    } while (0 < (int)uVar12);
  }
  return;
}

Assistant:

void PrintInfo(std::ostream &o, const lf::mesh::Mesh &mesh, int ctrl) {
  using dim_t = lf::base::dim_t;
  using size_type = lf::base::size_type;

  const dim_t dim_mesh = mesh.DimMesh();
  const dim_t dim_world = mesh.DimWorld();
  o << "Mesh of dimension " << static_cast<int>(dim_mesh)
    << ", ambient dimension " << static_cast<int>(dim_world) << '\n';

  if (ctrl > 10) {
    // Loop over codimensions

    for (int co_dim = base::narrow<int>(dim_mesh); co_dim >= 0; co_dim--) {
      const size_type no_ent = mesh.NumEntities(co_dim);
      o << "Co-dimension " << co_dim << ": " << no_ent << " entities" << '\n';

      // Loop over entities
      for (const Entity *e : mesh.Entities(co_dim)) {
        const size_type e_idx = mesh.Index(*e);
        const dim_t e_codim = e->Codim();
        const geometry::Geometry *e_geo_ptr = e->Geometry();
        const lf::base::RefEl e_refel = e->RefEl();

        LF_VERIFY_MSG(e_geo_ptr,
                      co_dim << "-entity " << e_idx << ": missing geometry");
        LF_VERIFY_MSG(e_geo_ptr->DimLocal() == dim_mesh - co_dim,
                      co_dim << "-entity " << e_idx << ": wrong dimension");
        LF_VERIFY_MSG(e_geo_ptr->RefEl() == e_refel,
                      co_dim << "-entity " << e_idx << ": refEl mismatch");
        LF_VERIFY_MSG(e_codim == co_dim, co_dim << "-entity " << e_idx
                                                << " co-dimension mismatch");
        const Eigen::MatrixXd &ref_el_corners(e_refel.NodeCoords());
        o << "entity " << e_idx << " (" << e_refel << "): ";

        // Loop over local co-dimensions
        if (ctrl > 90) {
          for (int l = 1; l <= base::narrow<int>(dim_mesh) - co_dim; l++) {
            o << "rel codim-" << l << " subent: [";
            // Fetch subentities of co-dimension l
            auto sub_ent_range = e->SubEntities(l);
            for (const Entity *sub_ent : sub_ent_range) {
              o << mesh.Index(*sub_ent) << ' ';
            }
            o << "]";
          }
        }
        if (ctrl > 50) {
          o << '\n' << e_geo_ptr->Global(ref_el_corners);
        }
        o << '\n';
      }  // end loop over entities
    }  // end loop over co-dimensions
  }  // end printinfo_ctrl > 10
}